

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O2

void fs_stdio_destroy_entry(ALLEGRO_FS_ENTRY *fh_)

{
  al_free_with_context
            (fh_[1].vtable,0x1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
             ,"fs_stdio_destroy_entry");
  if (fh_[0x15].vtable != (ALLEGRO_FS_INTERFACE *)0x0) {
    fs_stdio_close_directory(fh_);
  }
  al_free_with_context
            (fh_,0x1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
             ,"fs_stdio_destroy_entry");
  return;
}

Assistant:

static void fs_stdio_destroy_entry(ALLEGRO_FS_ENTRY *fh_)
{
   ALLEGRO_FS_ENTRY_STDIO *fh = (ALLEGRO_FS_ENTRY_STDIO *) fh_;

   al_free(fh->abs_path);
#ifdef ALLEGRO_WINDOWS
   al_free(fh->abs_path_utf8);
#endif

   if (fh->dir)
      fs_stdio_close_directory(fh_);

   al_free(fh);
}